

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# H30_binary_tree.c
# Opt level: O3

void insert(int key)

{
  int iVar1;
  NODE *pNVar2;
  NODE *pNVar3;
  node *pnVar4;
  NODE **ppNVar5;
  
  pNVar2 = root;
  if (root == (NODE *)0x0) {
    ppNVar5 = &root;
  }
  else {
    do {
      pNVar3 = pNVar2;
      iVar1 = pNVar3->data;
      if (iVar1 == key) {
        return;
      }
      pNVar2 = (&pNVar3->left)[iVar1 <= key];
    } while ((&pNVar3->left)[iVar1 <= key] != (node *)0x0);
    ppNVar5 = &pNVar3->left + (iVar1 <= key);
  }
  pnVar4 = (node *)malloc(0x18);
  pnVar4->left = (node *)0x0;
  pnVar4->right = (node *)0x0;
  pnVar4->data = key;
  *ppNVar5 = pnVar4;
  return;
}

Assistant:

void insert(int key) {
  NODE **p, *n;
  p = &root;
  while (*p != NULL) {
    if (key == (*p)->data)
      return;
    else if (key < (*p)->data)
      p = &(*p)->left;
    else
      p = &(*p)->right;
  }

  n = (NODE *)malloc(sizeof(NODE));
  n->left = NULL;
  n->right = NULL;
  n->data = key;
  *p = n;
}